

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O1

string * __thiscall nite::Color::str_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  undefined8 *puVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  string local_190;
  long *local_170;
  long local_168;
  long local_160;
  long lStack_158;
  string local_150;
  string local_130;
  string local_110;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  long lStack_d8;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 uStack_58;
  ulong *local_50;
  long local_48;
  ulong local_40;
  long lStack_38;
  
  toStr_abi_cxx11_(&local_190,(nite *)this,(double)this->r);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_190,0,(char *)0x0,0x24773b);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_160 = *plVar5;
    lStack_158 = plVar3[3];
    local_170 = &local_160;
  }
  else {
    local_160 = *plVar5;
    local_170 = (long *)*plVar3;
  }
  local_168 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar8 = ", ";
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c0 = *puVar6;
    lStack_b8 = plVar3[3];
    local_d0 = &local_c0;
  }
  else {
    local_c0 = *puVar6;
    local_d0 = (ulong *)*plVar3;
  }
  local_c8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  toStr_abi_cxx11_(&local_150,(nite *)pcVar8,(double)this->g);
  uVar9 = 0xf;
  if (local_d0 != &local_c0) {
    uVar9 = local_c0;
  }
  if (uVar9 < local_150._M_string_length + local_c8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      uVar10 = local_150.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_150._M_string_length + local_c8) goto LAB_00180f17;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_150,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_00180f17:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_150._M_dataplus._M_p);
  }
  local_70 = &local_60;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_60 = *puVar1;
    uStack_58 = puVar4[3];
  }
  else {
    local_60 = *puVar1;
    local_70 = (undefined8 *)*puVar4;
  }
  local_68 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pcVar8 = ", ";
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_40 = *puVar6;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *puVar6;
    local_50 = (ulong *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  toStr_abi_cxx11_(&local_130,(nite *)pcVar8,(double)this->b);
  uVar9 = 0xf;
  if (local_50 != &local_40) {
    uVar9 = local_40;
  }
  if (uVar9 < local_130._M_string_length + local_48) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      uVar10 = local_130.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar10 < local_130._M_string_length + local_48) goto LAB_0018102a;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_0018102a:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_130._M_dataplus._M_p);
  }
  local_90 = &local_80;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_80 = *puVar1;
    uStack_78 = puVar4[3];
  }
  else {
    local_80 = *puVar1;
    local_90 = (undefined8 *)*puVar4;
  }
  local_88 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  pcVar8 = ", ";
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_e0 = *puVar6;
    lStack_d8 = plVar3[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar3;
  }
  local_e8 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  toStr_abi_cxx11_(&local_110,(nite *)pcVar8,(double)this->a);
  uVar9 = 0xf;
  if (local_f0 != &local_e0) {
    uVar9 = local_e0;
  }
  if (uVar9 < local_110._M_string_length + local_e8) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar10 = local_110.field_2._M_allocated_capacity;
    }
    if (local_110._M_string_length + local_e8 <= (ulong)uVar10) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0018117a;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_110._M_dataplus._M_p);
LAB_0018117a:
  local_b0 = &local_a0;
  puVar1 = puVar4 + 2;
  if ((undefined8 *)*puVar4 == puVar1) {
    local_a0 = *puVar1;
    uStack_98 = puVar4[3];
  }
  else {
    local_a0 = *puVar1;
    local_b0 = (undefined8 *)*puVar4;
  }
  local_a8 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_b0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    lVar2 = plVar3[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

String nite::Color::str(){
	return "("+toStr(r)+", "+toStr(g)+", "+toStr(b)+", "+toStr(a)+")";
}